

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O0

string * __thiscall
lsp::ArxmlStorage::getUriFromFileIndex_abi_cxx11_
          (string *__return_storage_ptr__,ArxmlStorage *this,uint32_t fileIndex)

{
  reference pvVar1;
  uint32_t fileIndex_local;
  ArxmlStorage *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->URIs_,(ulong)fileIndex);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string lsp::ArxmlStorage::getUriFromFileIndex(uint32_t fileIndex)
{
    return URIs_[fileIndex];
}